

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec128.c
# Opt level: O2

void Hacl_Chacha20_Vec128_chacha20_decrypt_128
               (uint32_t len,uint8_t *out,uint8_t *cipher,uint8_t *key,uint8_t *n,uint32_t ctr)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint32_t i;
  ulong uVar21;
  long lVar22;
  Lib_IntVector_Intrinsics_vec128 ctx [16];
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint local_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint uStack_2fc;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint local_2c8;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  uint local_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint local_2a8;
  uint uStack_2a4;
  uint uStack_2a0;
  uint uStack_29c;
  uint local_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint local_288;
  uint uStack_284;
  uint uStack_280;
  uint uStack_27c;
  uint local_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  uint local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  uint local_248;
  uint uStack_244;
  uint uStack_240;
  uint uStack_23c;
  longlong local_238 [32];
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  memset((Lib_IntVector_Intrinsics_vec128 *)local_238,0,0x100);
  chacha20_init_128((Lib_IntVector_Intrinsics_vec128 *)local_238,key,n,ctr);
  lVar22 = 0xf0;
  for (uVar21 = 0; len >> 8 != uVar21; uVar21 = uVar21 + 1) {
    memset((Lib_IntVector_Intrinsics_vec128 *)&local_338,0,0x100);
    chacha20_core_128((Lib_IntVector_Intrinsics_vec128 *)&local_338,
                      (Lib_IntVector_Intrinsics_vec128 *)local_238,(uint32_t)uVar21);
    uVar3 = uStack_334;
    uVar4 = uStack_324;
    uVar5 = uStack_314;
    uVar6 = uStack_304;
    uVar7 = uStack_2f4;
    uVar8 = uStack_2f0;
    uVar9 = uStack_2e0;
    uVar10 = uStack_2d0;
    uVar11 = uStack_2c0;
    uVar12 = uStack_2a0;
    uVar13 = uStack_2b0;
    uVar14 = uStack_330;
    uVar15 = uStack_320;
    uVar16 = uStack_310;
    uVar17 = uStack_300;
    puVar1 = (uint *)(cipher + lVar22 + -0xf0);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0xf0);
    *puVar2 = *puVar1 ^ local_338;
    puVar2[1] = uVar18 ^ local_328;
    puVar2[2] = uVar19 ^ local_318;
    puVar2[3] = uVar20 ^ local_308;
    puVar1 = (uint *)(cipher + lVar22 + -0xe0);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0xe0);
    *puVar2 = *puVar1 ^ local_2f8;
    puVar2[1] = uVar18 ^ local_2e8;
    puVar2[2] = uVar19 ^ local_2d8;
    puVar2[3] = uVar20 ^ local_2c8;
    puVar1 = (uint *)(cipher + lVar22 + -0xd0);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0xd0);
    *puVar2 = *puVar1 ^ local_2b8;
    puVar2[1] = uVar18 ^ local_2a8;
    puVar2[2] = uVar19 ^ local_298;
    puVar2[3] = uVar20 ^ local_288;
    puVar1 = (uint *)(cipher + lVar22 + -0xc0);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0xc0);
    *puVar2 = *puVar1 ^ local_278;
    puVar2[1] = uVar18 ^ local_268;
    puVar2[2] = uVar19 ^ local_258;
    puVar2[3] = uVar20 ^ local_248;
    puVar1 = (uint *)(cipher + lVar22 + -0xb0);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0xb0);
    *puVar2 = *puVar1 ^ uStack_334;
    puVar2[1] = uVar18 ^ uStack_324;
    puVar2[2] = uVar19 ^ uStack_314;
    puVar2[3] = uVar20 ^ uStack_304;
    puVar1 = (uint *)(cipher + lVar22 + -0xa0);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0xa0);
    *puVar2 = *puVar1 ^ uStack_2f4;
    puVar2[1] = uVar18 ^ uStack_2e4;
    puVar2[2] = uVar19 ^ uStack_2d4;
    puVar2[3] = uVar20 ^ uStack_2c4;
    puVar1 = (uint *)(cipher + lVar22 + -0x90);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0x90);
    *puVar2 = *puVar1 ^ uStack_2b4;
    puVar2[1] = uVar18 ^ uStack_2a4;
    puVar2[2] = uVar19 ^ uStack_294;
    puVar2[3] = uVar20 ^ uStack_284;
    puVar1 = (uint *)(cipher + lVar22 + -0x80);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0x80);
    *puVar2 = *puVar1 ^ uStack_274;
    puVar2[1] = uVar18 ^ uStack_264;
    puVar2[2] = uVar19 ^ uStack_254;
    puVar2[3] = uVar20 ^ uStack_244;
    puVar1 = (uint *)(cipher + lVar22 + -0x70);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0x70);
    *puVar2 = *puVar1 ^ uStack_330;
    puVar2[1] = uVar18 ^ uStack_320;
    puVar2[2] = uVar19 ^ uStack_310;
    puVar2[3] = uVar20 ^ uStack_300;
    puVar1 = (uint *)(cipher + lVar22 + -0x60);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0x60);
    *puVar2 = *puVar1 ^ uStack_2f0;
    puVar2[1] = uVar18 ^ uStack_2e0;
    puVar2[2] = uVar19 ^ uStack_2d0;
    puVar2[3] = uVar20 ^ uStack_2c0;
    puVar1 = (uint *)(cipher + lVar22 + -0x50);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0x50);
    *puVar2 = *puVar1 ^ uStack_2b0;
    puVar2[1] = uVar18 ^ uStack_2a0;
    puVar2[2] = uVar19 ^ uStack_290;
    puVar2[3] = uVar20 ^ uStack_280;
    puVar1 = (uint *)(cipher + lVar22 + -0x40);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0x40);
    *puVar2 = *puVar1 ^ uStack_270;
    puVar2[1] = uVar18 ^ uStack_260;
    puVar2[2] = uVar19 ^ uStack_250;
    puVar2[3] = uVar20 ^ uStack_240;
    puVar1 = (uint *)(cipher + lVar22 + -0x30);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0x30);
    *puVar2 = *puVar1 ^ uStack_32c;
    puVar2[1] = uVar18 ^ uStack_31c;
    puVar2[2] = uVar19 ^ uStack_30c;
    puVar2[3] = uVar20 ^ uStack_2fc;
    puVar1 = (uint *)(cipher + lVar22 + -0x20);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0x20);
    *puVar2 = *puVar1 ^ uStack_2ec;
    puVar2[1] = uVar18 ^ uStack_2dc;
    puVar2[2] = uVar19 ^ uStack_2cc;
    puVar2[3] = uVar20 ^ uStack_2bc;
    puVar1 = (uint *)(cipher + lVar22 + -0x10);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22 + -0x10);
    *puVar2 = *puVar1 ^ uStack_2ac;
    puVar2[1] = uVar18 ^ uStack_29c;
    puVar2[2] = uVar19 ^ uStack_28c;
    puVar2[3] = uVar20 ^ uStack_27c;
    puVar1 = (uint *)(cipher + lVar22);
    uVar18 = puVar1[1];
    uVar19 = puVar1[2];
    uVar20 = puVar1[3];
    puVar2 = (uint *)(out + lVar22);
    *puVar2 = *puVar1 ^ uStack_26c;
    puVar2[1] = uVar18 ^ uStack_25c;
    puVar2[2] = uVar19 ^ uStack_24c;
    puVar2[3] = uVar20 ^ uStack_23c;
    lVar22 = lVar22 + 0x100;
    uStack_334 = local_328;
    uStack_330 = local_318;
    uStack_32c = local_308;
    local_328 = local_2f8;
    uStack_324 = local_2e8;
    uStack_320 = local_2d8;
    uStack_31c = local_2c8;
    local_318 = local_2b8;
    uStack_314 = local_2a8;
    uStack_310 = local_298;
    uStack_30c = local_288;
    local_308 = local_278;
    uStack_304 = local_268;
    uStack_300 = local_258;
    uStack_2fc = local_248;
    local_2f8 = uVar3;
    uStack_2f4 = uVar4;
    uStack_2f0 = uVar5;
    uStack_2ec = uVar6;
    local_2e8 = uVar7;
    uStack_2e0 = uStack_2d4;
    uStack_2dc = uStack_2c4;
    local_2d8 = uStack_2b4;
    uStack_2d4 = uStack_2a4;
    uStack_2d0 = uStack_294;
    uStack_2cc = uStack_284;
    local_2c8 = uStack_274;
    uStack_2c4 = uStack_264;
    uStack_2c0 = uStack_254;
    uStack_2bc = uStack_244;
    local_2b8 = uVar14;
    uStack_2b4 = uVar15;
    uStack_2b0 = uVar16;
    uStack_2ac = uVar17;
    local_2a8 = uVar8;
    uStack_2a4 = uVar9;
    uStack_2a0 = uVar10;
    uStack_29c = uVar11;
    local_298 = uVar13;
    uStack_294 = uVar12;
    uStack_28c = uStack_280;
    local_288 = uStack_270;
    uStack_284 = uStack_260;
    uStack_280 = uStack_250;
    uStack_27c = uStack_240;
  }
  if ((len & 0xff) != 0) {
    uVar21 = (ulong)(len & 0xff);
    memset((void *)((long)&local_338 + uVar21),0,0x100 - uVar21);
    memcpy(&local_338,cipher + (len & 0xffffff00),uVar21);
    memset((Lib_IntVector_Intrinsics_vec128 *)&local_138,0,0x100);
    chacha20_core_128((Lib_IntVector_Intrinsics_vec128 *)&local_138,
                      (Lib_IntVector_Intrinsics_vec128 *)local_238,len >> 8);
    local_338 = local_138 ^ local_338;
    uStack_334 = local_128 ^ uStack_334;
    uStack_330 = local_118 ^ uStack_330;
    uStack_32c = local_108 ^ uStack_32c;
    local_328 = local_f8 ^ local_328;
    uStack_324 = local_e8 ^ uStack_324;
    uStack_320 = local_d8 ^ uStack_320;
    uStack_31c = local_c8 ^ uStack_31c;
    local_318 = local_b8 ^ local_318;
    uStack_314 = local_a8 ^ uStack_314;
    uStack_310 = local_98 ^ uStack_310;
    uStack_30c = local_88 ^ uStack_30c;
    local_378 = (uint)local_58;
    uStack_374 = (uint)((ulong)local_58 >> 0x20);
    uStack_370 = (uint)uStack_50;
    uStack_36c = (uint)((ulong)uStack_50 >> 0x20);
    local_308 = local_78 ^ local_308;
    uStack_304 = local_68 ^ uStack_304;
    uStack_300 = local_378 ^ uStack_300;
    uStack_2fc = local_48 ^ uStack_2fc;
    local_2f8 = uStack_134 ^ local_2f8;
    uStack_2f4 = uStack_124 ^ uStack_2f4;
    uStack_2f0 = uStack_114 ^ uStack_2f0;
    uStack_2ec = uStack_104 ^ uStack_2ec;
    local_2e8 = uStack_f4 ^ local_2e8;
    uStack_2e4 = uStack_e4 ^ uStack_2e4;
    uStack_2e0 = uStack_d4 ^ uStack_2e0;
    uStack_2dc = uStack_c4 ^ uStack_2dc;
    local_2d8 = uStack_b4 ^ local_2d8;
    uStack_2d4 = uStack_a4 ^ uStack_2d4;
    uStack_2d0 = uStack_94 ^ uStack_2d0;
    uStack_2cc = uStack_84 ^ uStack_2cc;
    local_2c8 = uStack_74 ^ local_2c8;
    uStack_2c4 = uStack_64 ^ uStack_2c4;
    uStack_2c0 = uStack_374 ^ uStack_2c0;
    uStack_2bc = uStack_44 ^ uStack_2bc;
    local_2b8 = uStack_130 ^ local_2b8;
    uStack_2b4 = uStack_120 ^ uStack_2b4;
    uStack_2b0 = uStack_110 ^ uStack_2b0;
    uStack_2ac = uStack_100 ^ uStack_2ac;
    local_2a8 = uStack_f0 ^ local_2a8;
    uStack_2a4 = uStack_e0 ^ uStack_2a4;
    uStack_2a0 = uStack_d0 ^ uStack_2a0;
    uStack_29c = uStack_c0 ^ uStack_29c;
    local_298 = uStack_b0 ^ local_298;
    uStack_294 = uStack_a0 ^ uStack_294;
    uStack_290 = uStack_90 ^ uStack_290;
    uStack_28c = uStack_80 ^ uStack_28c;
    local_288 = uStack_70 ^ local_288;
    uStack_284 = uStack_60 ^ uStack_284;
    uStack_280 = uStack_370 ^ uStack_280;
    uStack_27c = uStack_40 ^ uStack_27c;
    local_278 = uStack_12c ^ local_278;
    uStack_274 = uStack_11c ^ uStack_274;
    uStack_270 = uStack_10c ^ uStack_270;
    uStack_26c = uStack_fc ^ uStack_26c;
    local_268 = uStack_ec ^ local_268;
    uStack_264 = uStack_dc ^ uStack_264;
    uStack_260 = uStack_cc ^ uStack_260;
    uStack_25c = uStack_bc ^ uStack_25c;
    local_258 = uStack_ac ^ local_258;
    uStack_254 = uStack_9c ^ uStack_254;
    uStack_250 = uStack_8c ^ uStack_250;
    uStack_24c = uStack_7c ^ uStack_24c;
    local_248 = uStack_6c ^ local_248;
    uStack_244 = uStack_5c ^ uStack_244;
    uStack_240 = uStack_36c ^ uStack_240;
    uStack_23c = uStack_3c ^ uStack_23c;
    memcpy(out + (len & 0xffffff00),&local_338,uVar21);
  }
  return;
}

Assistant:

void
Hacl_Chacha20_Vec128_chacha20_decrypt_128(
  uint32_t len,
  uint8_t *out,
  uint8_t *cipher,
  uint8_t *key,
  uint8_t *n,
  uint32_t ctr
)
{
  KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 ctx[16U] KRML_POST_ALIGN(16) = { 0U };
  chacha20_init_128(ctx, key, n, ctr);
  uint32_t rem = len % 256U;
  uint32_t nb = len / 256U;
  uint32_t rem1 = len % 256U;
  for (uint32_t i = 0U; i < nb; i++)
  {
    uint8_t *uu____0 = out + i * 256U;
    uint8_t *uu____1 = cipher + i * 256U;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 k[16U] KRML_POST_ALIGN(16) = { 0U };
    chacha20_core_128(k, ctx, i);
    Lib_IntVector_Intrinsics_vec128 st0 = k[0U];
    Lib_IntVector_Intrinsics_vec128 st1 = k[1U];
    Lib_IntVector_Intrinsics_vec128 st2 = k[2U];
    Lib_IntVector_Intrinsics_vec128 st3 = k[3U];
    Lib_IntVector_Intrinsics_vec128 st4 = k[4U];
    Lib_IntVector_Intrinsics_vec128 st5 = k[5U];
    Lib_IntVector_Intrinsics_vec128 st6 = k[6U];
    Lib_IntVector_Intrinsics_vec128 st7 = k[7U];
    Lib_IntVector_Intrinsics_vec128 st8 = k[8U];
    Lib_IntVector_Intrinsics_vec128 st9 = k[9U];
    Lib_IntVector_Intrinsics_vec128 st10 = k[10U];
    Lib_IntVector_Intrinsics_vec128 st11 = k[11U];
    Lib_IntVector_Intrinsics_vec128 st12 = k[12U];
    Lib_IntVector_Intrinsics_vec128 st13 = k[13U];
    Lib_IntVector_Intrinsics_vec128 st14 = k[14U];
    Lib_IntVector_Intrinsics_vec128 st15 = k[15U];
    Lib_IntVector_Intrinsics_vec128
    v0_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v1_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v2_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v3_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v0__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v1__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v2__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128
    v3__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128 v0__0 = v0__;
    Lib_IntVector_Intrinsics_vec128 v2__0 = v2__;
    Lib_IntVector_Intrinsics_vec128 v1__0 = v1__;
    Lib_IntVector_Intrinsics_vec128 v3__0 = v3__;
    Lib_IntVector_Intrinsics_vec128 v0 = v0__0;
    Lib_IntVector_Intrinsics_vec128 v1 = v1__0;
    Lib_IntVector_Intrinsics_vec128 v2 = v2__0;
    Lib_IntVector_Intrinsics_vec128 v3 = v3__0;
    Lib_IntVector_Intrinsics_vec128
    v0_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v1_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v2_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v3_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v0__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v1__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v2__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128
    v3__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128 v0__2 = v0__1;
    Lib_IntVector_Intrinsics_vec128 v2__2 = v2__1;
    Lib_IntVector_Intrinsics_vec128 v1__2 = v1__1;
    Lib_IntVector_Intrinsics_vec128 v3__2 = v3__1;
    Lib_IntVector_Intrinsics_vec128 v4 = v0__2;
    Lib_IntVector_Intrinsics_vec128 v5 = v1__2;
    Lib_IntVector_Intrinsics_vec128 v6 = v2__2;
    Lib_IntVector_Intrinsics_vec128 v7 = v3__2;
    Lib_IntVector_Intrinsics_vec128
    v0_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v1_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v2_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v3_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v0__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v1__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v2__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128
    v3__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128 v0__4 = v0__3;
    Lib_IntVector_Intrinsics_vec128 v2__4 = v2__3;
    Lib_IntVector_Intrinsics_vec128 v1__4 = v1__3;
    Lib_IntVector_Intrinsics_vec128 v3__4 = v3__3;
    Lib_IntVector_Intrinsics_vec128 v8 = v0__4;
    Lib_IntVector_Intrinsics_vec128 v9 = v1__4;
    Lib_IntVector_Intrinsics_vec128 v10 = v2__4;
    Lib_IntVector_Intrinsics_vec128 v11 = v3__4;
    Lib_IntVector_Intrinsics_vec128
    v0_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v1_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v2_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v3_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v0__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v1__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v2__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128
    v3__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128 v0__6 = v0__5;
    Lib_IntVector_Intrinsics_vec128 v2__6 = v2__5;
    Lib_IntVector_Intrinsics_vec128 v1__6 = v1__5;
    Lib_IntVector_Intrinsics_vec128 v3__6 = v3__5;
    Lib_IntVector_Intrinsics_vec128 v12 = v0__6;
    Lib_IntVector_Intrinsics_vec128 v13 = v1__6;
    Lib_IntVector_Intrinsics_vec128 v14 = v2__6;
    Lib_IntVector_Intrinsics_vec128 v15 = v3__6;
    k[0U] = v0;
    k[1U] = v4;
    k[2U] = v8;
    k[3U] = v12;
    k[4U] = v1;
    k[5U] = v5;
    k[6U] = v9;
    k[7U] = v13;
    k[8U] = v2;
    k[9U] = v6;
    k[10U] = v10;
    k[11U] = v14;
    k[12U] = v3;
    k[13U] = v7;
    k[14U] = v11;
    k[15U] = v15;
    KRML_MAYBE_FOR16(i0,
      0U,
      16U,
      1U,
      Lib_IntVector_Intrinsics_vec128
      x = Lib_IntVector_Intrinsics_vec128_load32_le(uu____1 + i0 * 16U);
      Lib_IntVector_Intrinsics_vec128 y = Lib_IntVector_Intrinsics_vec128_xor(x, k[i0]);
      Lib_IntVector_Intrinsics_vec128_store32_le(uu____0 + i0 * 16U, y););
  }
  if (rem1 > 0U)
  {
    uint8_t *uu____2 = out + nb * 256U;
    uint8_t plain[256U] = { 0U };
    memcpy(plain, cipher + nb * 256U, rem * sizeof (uint8_t));
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 k[16U] KRML_POST_ALIGN(16) = { 0U };
    chacha20_core_128(k, ctx, nb);
    Lib_IntVector_Intrinsics_vec128 st0 = k[0U];
    Lib_IntVector_Intrinsics_vec128 st1 = k[1U];
    Lib_IntVector_Intrinsics_vec128 st2 = k[2U];
    Lib_IntVector_Intrinsics_vec128 st3 = k[3U];
    Lib_IntVector_Intrinsics_vec128 st4 = k[4U];
    Lib_IntVector_Intrinsics_vec128 st5 = k[5U];
    Lib_IntVector_Intrinsics_vec128 st6 = k[6U];
    Lib_IntVector_Intrinsics_vec128 st7 = k[7U];
    Lib_IntVector_Intrinsics_vec128 st8 = k[8U];
    Lib_IntVector_Intrinsics_vec128 st9 = k[9U];
    Lib_IntVector_Intrinsics_vec128 st10 = k[10U];
    Lib_IntVector_Intrinsics_vec128 st11 = k[11U];
    Lib_IntVector_Intrinsics_vec128 st12 = k[12U];
    Lib_IntVector_Intrinsics_vec128 st13 = k[13U];
    Lib_IntVector_Intrinsics_vec128 st14 = k[14U];
    Lib_IntVector_Intrinsics_vec128 st15 = k[15U];
    Lib_IntVector_Intrinsics_vec128
    v0_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v1_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v2_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v3_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v0__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v1__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v2__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128
    v3__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128 v0__0 = v0__;
    Lib_IntVector_Intrinsics_vec128 v2__0 = v2__;
    Lib_IntVector_Intrinsics_vec128 v1__0 = v1__;
    Lib_IntVector_Intrinsics_vec128 v3__0 = v3__;
    Lib_IntVector_Intrinsics_vec128 v0 = v0__0;
    Lib_IntVector_Intrinsics_vec128 v1 = v1__0;
    Lib_IntVector_Intrinsics_vec128 v2 = v2__0;
    Lib_IntVector_Intrinsics_vec128 v3 = v3__0;
    Lib_IntVector_Intrinsics_vec128
    v0_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v1_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v2_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v3_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v0__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v1__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v2__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128
    v3__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128 v0__2 = v0__1;
    Lib_IntVector_Intrinsics_vec128 v2__2 = v2__1;
    Lib_IntVector_Intrinsics_vec128 v1__2 = v1__1;
    Lib_IntVector_Intrinsics_vec128 v3__2 = v3__1;
    Lib_IntVector_Intrinsics_vec128 v4 = v0__2;
    Lib_IntVector_Intrinsics_vec128 v5 = v1__2;
    Lib_IntVector_Intrinsics_vec128 v6 = v2__2;
    Lib_IntVector_Intrinsics_vec128 v7 = v3__2;
    Lib_IntVector_Intrinsics_vec128
    v0_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v1_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v2_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v3_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v0__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v1__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v2__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128
    v3__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128 v0__4 = v0__3;
    Lib_IntVector_Intrinsics_vec128 v2__4 = v2__3;
    Lib_IntVector_Intrinsics_vec128 v1__4 = v1__3;
    Lib_IntVector_Intrinsics_vec128 v3__4 = v3__3;
    Lib_IntVector_Intrinsics_vec128 v8 = v0__4;
    Lib_IntVector_Intrinsics_vec128 v9 = v1__4;
    Lib_IntVector_Intrinsics_vec128 v10 = v2__4;
    Lib_IntVector_Intrinsics_vec128 v11 = v3__4;
    Lib_IntVector_Intrinsics_vec128
    v0_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v1_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v2_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v3_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v0__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v1__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v2__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128
    v3__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128 v0__6 = v0__5;
    Lib_IntVector_Intrinsics_vec128 v2__6 = v2__5;
    Lib_IntVector_Intrinsics_vec128 v1__6 = v1__5;
    Lib_IntVector_Intrinsics_vec128 v3__6 = v3__5;
    Lib_IntVector_Intrinsics_vec128 v12 = v0__6;
    Lib_IntVector_Intrinsics_vec128 v13 = v1__6;
    Lib_IntVector_Intrinsics_vec128 v14 = v2__6;
    Lib_IntVector_Intrinsics_vec128 v15 = v3__6;
    k[0U] = v0;
    k[1U] = v4;
    k[2U] = v8;
    k[3U] = v12;
    k[4U] = v1;
    k[5U] = v5;
    k[6U] = v9;
    k[7U] = v13;
    k[8U] = v2;
    k[9U] = v6;
    k[10U] = v10;
    k[11U] = v14;
    k[12U] = v3;
    k[13U] = v7;
    k[14U] = v11;
    k[15U] = v15;
    KRML_MAYBE_FOR16(i,
      0U,
      16U,
      1U,
      Lib_IntVector_Intrinsics_vec128
      x = Lib_IntVector_Intrinsics_vec128_load32_le(plain + i * 16U);
      Lib_IntVector_Intrinsics_vec128 y = Lib_IntVector_Intrinsics_vec128_xor(x, k[i]);
      Lib_IntVector_Intrinsics_vec128_store32_le(plain + i * 16U, y););
    memcpy(uu____2, plain, rem * sizeof (uint8_t));
  }
}